

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playableWorld.cpp
# Opt level: O1

void __thiscall playableWorld::playableWorld(playableWorld *this)

{
  this->pl = 0;
  World::World(&this->world);
  (this->agent_direction)._M_dataplus._M_p = (pointer)&(this->agent_direction).field_2;
  (this->agent_direction)._M_string_length = 0;
  (this->agent_direction).field_2._M_local_buf[0] = '\0';
  (this->agent_location).first = 0;
  (this->agent_location).second = 0;
  return;
}

Assistant:

playableWorld::playableWorld(){}